

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

NeuralNetworkImageScaler * __thiscall
CoreML::Specification::NeuralNetworkImageScaler::New(NeuralNetworkImageScaler *this,Arena *arena)

{
  NeuralNetworkImageScaler *this_00;
  NeuralNetworkImageScaler *n;
  Arena *arena_local;
  NeuralNetworkImageScaler *this_local;
  
  this_00 = (NeuralNetworkImageScaler *)operator_new(0x28);
  NeuralNetworkImageScaler(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NeuralNetworkImageScaler>(arena,this_00);
  }
  return this_00;
}

Assistant:

NeuralNetworkImageScaler* NeuralNetworkImageScaler::New(::google::protobuf::Arena* arena) const {
  NeuralNetworkImageScaler* n = new NeuralNetworkImageScaler;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}